

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEAngle.cpp
# Opt level: O0

void __thiscall test_CEAngle::test_CEAngle(test_CEAngle *this)

{
  CEAngle *in_RDI;
  CEAngle *in_stack_ffffffffffffffb8;
  CEAngle *angle;
  
  CETestSuite::CETestSuite((CETestSuite *)in_RDI);
  in_RDI->_vptr_CEAngle = (_func_int **)&PTR__test_CEAngle_00154590;
  angle = in_RDI + 0x22;
  CEAngle::CEAngle((CEAngle *)0x11cf08);
  CEAngle::CEAngle((CEAngle *)0x3ff921fb54442d18,(double *)angle);
  CEAngle::operator=(in_RDI,in_stack_ffffffffffffffb8);
  CEAngle::~CEAngle((CEAngle *)0x11cf4c);
  return;
}

Assistant:

test_CEAngle::test_CEAngle() :
    CETestSuite()
{
    // Let's use 45 degrees for the tests, or PI/2
    base_ = CEAngle(M_PI_2);
}